

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMalformedImages.cpp
# Opt level: O1

void anon_unknown.dwarf_19f01e::readImage(char *inFileName)

{
  int scanLine2;
  int iVar1;
  size_t sVar2;
  Header *other;
  Box2i *pBVar3;
  ulong uVar4;
  void *pvVar5;
  size_t yStride;
  long lVar6;
  AcesInputFile in;
  Header h;
  allocator<char> local_99;
  AcesInputFile local_98;
  string local_88;
  Header local_68;
  
  local_88._M_dataplus._M_p = (pointer)0x0;
  Imf_2_5::Header::Header(&local_68,0x40,0x40,1.0,(V2f *)&local_88,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reading file ",0xd);
  if (inFileName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x442478);
  }
  else {
    sVar2 = strlen(inFileName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,inFileName,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,inFileName,&local_99);
  iVar1 = Imf_2_5::globalThreadCount();
  Imf_2_5::AcesInputFile::AcesInputFile(&local_98,&local_88,iVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  other = Imf_2_5::AcesInputFile::header(&local_98);
  Imf_2_5::Header::operator=(&local_68,other);
  pBVar3 = Imf_2_5::Header::dataWindow(&local_68);
  lVar6 = (long)(pBVar3->min).x;
  iVar1 = (pBVar3->min).y;
  scanLine2 = (pBVar3->max).y;
  yStride = ((pBVar3->max).x - lVar6) + 1;
  uVar4 = (long)((scanLine2 - iVar1) + 1) * yStride;
  pvVar5 = operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
  Imf_2_5::AcesInputFile::setFrameBuffer
            (&local_98,(Rgba *)((long)pvVar5 + (long)((int)yStride * iVar1) * -8 + lVar6 * -8),1,
             yStride);
  Imf_2_5::AcesInputFile::readPixels(&local_98,iVar1,scanLine2);
  Imf_2_5::AcesInputFile::~AcesInputFile(&local_98);
  Imf_2_5::Header::~Header(&local_68);
  operator_delete__(pvVar5);
  return;
}

Assistant:

void
readImage (const char inFileName[])
{
	Array2D<Rgba> p;
	Header h;
	Box2i dw;
	int width;
	int height;

	{
		cout << "Reading file " << inFileName << endl;

		AcesInputFile in (inFileName);

		h = in.header();
		dw = h.dataWindow();

		width  = dw.max.x - dw.min.x + 1;
		height = dw.max.y - dw.min.y + 1;
		p.resizeErase (height, width);

		in.setFrameBuffer (&p[0][0] - dw.min.x - dw.min.y * width, 1, width);
		in.readPixels (dw.min.y, dw.max.y);
	}
}